

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O1

bool slang::syntax::SyntaxFacts::isAllowedInModule(SyntaxKind kind)

{
  bool bVar1;
  
  if ((int)kind < 0x15d) {
    if ((((0x36 < kind - ExternModuleDecl) ||
         ((0x40000000020001U >> ((ulong)(kind - ExternModuleDecl) & 0x3f) & 1) == 0)) &&
        (kind != DefParam)) && (kind != ModuleDeclaration)) goto LAB_001a154c;
  }
  else if (((0xd < kind - PortDeclaration) ||
           ((0x2081U >> (kind - PortDeclaration & 0x1f) & 1) == 0)) &&
          ((0x1d < kind - SpecifyBlock || ((0x20000003U >> (kind - SpecifyBlock & 0x1f) & 1) == 0)))
          ) {
LAB_001a154c:
    bVar1 = isModuleCommonItem(kind);
    return bVar1;
  }
  return true;
}

Assistant:

bool SyntaxFacts::isAllowedInModule(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::PortDeclaration:
        case SyntaxKind::GenerateRegion:
        case SyntaxKind::ModuleDeclaration:
        case SyntaxKind::InterfaceDeclaration:
        case SyntaxKind::ProgramDeclaration:
        case SyntaxKind::ExternModuleDecl:
        case SyntaxKind::TimeUnitsDeclaration:
        case SyntaxKind::SpecparamDeclaration:
        case SyntaxKind::SpecifyBlock:
            return true;
        default:
            return isAllowedInGenerate(kind);
    }
}